

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClass.c
# Opt level: O2

void Fra_ClassesPrint(Fra_Cla_t *p,int fVeryVerbose)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  Aig_Obj_t *pObj;
  Aig_Obj_t **pClass;
  int iVar4;
  uint uVar5;
  
  uVar5 = p->vClasses1->nSize;
  uVar2 = p->vClasses->nSize;
  uVar1 = Fra_ClassesCountLits(p);
  printf("Const = %5d. Class = %5d. Lit = %5d. ",(ulong)uVar5,(ulong)uVar2,(ulong)uVar1);
  if ((p->vImps != (Vec_Int_t *)0x0) && (0 < p->vImps->nSize)) {
    printf("Imp = %5d. ");
  }
  putchar(10);
  if (fVeryVerbose != 0) {
    iVar4 = 0;
    do {
      if (p->vClasses1->nSize <= iVar4) {
        printf("Constants { ");
        for (iVar4 = 0; iVar4 < p->vClasses1->nSize; iVar4 = iVar4 + 1) {
          pObj = (Aig_Obj_t *)Vec_PtrEntry(p->vClasses1,iVar4);
          uVar5 = pObj->Id;
          uVar2 = *(uint *)&pObj->field_0x1c;
          uVar1 = Aig_SupportSize(p->pAig,pObj);
          printf("%d(%d,%d) ",(ulong)uVar5,(ulong)(uVar2 & 0xffffff),(ulong)uVar1);
        }
        puts("}");
        for (uVar5 = 0; (int)uVar5 < p->vClasses->nSize; uVar5 = uVar5 + 1) {
          pClass = (Aig_Obj_t **)Vec_PtrEntry(p->vClasses,uVar5);
          uVar2 = Fra_ClassCount(pClass);
          printf("%3d (%3d) : ",(ulong)uVar5,(ulong)uVar2);
          Fra_PrintClass(p,pClass);
        }
        putchar(10);
        return;
      }
      pvVar3 = Vec_PtrEntry(p->vClasses1,iVar4);
      iVar4 = iVar4 + 1;
    } while (*(Aig_Obj_t **)
              (*(long *)(*(long *)(*(long *)((long)pvVar3 + 0x28) + 0x30) + 8) +
              (long)*(int *)((long)pvVar3 + 0x24) * 8) == p->pAig->pConst1);
    __assert_fail("Fra_ClassObjRepr(pObj) == Aig_ManConst1(p->pAig)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClass.c"
                  ,0xfb,"void Fra_ClassesPrint(Fra_Cla_t *, int)");
  }
  return;
}

Assistant:

void Fra_ClassesPrint( Fra_Cla_t * p, int fVeryVerbose )
{
    Aig_Obj_t ** pClass;
    Aig_Obj_t * pObj;
    int i;

    printf( "Const = %5d. Class = %5d. Lit = %5d. ", 
        Vec_PtrSize(p->vClasses1), Vec_PtrSize(p->vClasses), Fra_ClassesCountLits(p) );
    if ( p->vImps && Vec_IntSize(p->vImps) > 0 )
        printf( "Imp = %5d. ", Vec_IntSize(p->vImps) );
    printf( "\n" );

    if ( fVeryVerbose )
    {
        Vec_PtrForEachEntry( Aig_Obj_t *, p->vClasses1, pObj, i )
            assert( Fra_ClassObjRepr(pObj) == Aig_ManConst1(p->pAig) );
        printf( "Constants { " );
        Vec_PtrForEachEntry( Aig_Obj_t *, p->vClasses1, pObj, i )
            printf( "%d(%d,%d) ", pObj->Id, pObj->Level, Aig_SupportSize(p->pAig,pObj) );
        printf( "}\n" );
        Vec_PtrForEachEntry( Aig_Obj_t **, p->vClasses, pClass, i )
        {
            printf( "%3d (%3d) : ", i, Fra_ClassCount(pClass) );
            Fra_PrintClass( p, pClass );
        }
        printf( "\n" );
    }
}